

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *
tinyusdz::lerp<tinyusdz::value::normal3h>
          (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a,
          vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b,double t)

{
  pointer pnVar1;
  normal3h nVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  normal3h local_48;
  normal3h local_40 [2];
  float local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = ((long)(a->
                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      local_34 = (float)(1.0 - t);
      lVar4 = 0;
      do {
        pnVar1 = (b->
                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        nVar2 = operator*(local_34,(normal3h *)
                                   ((long)&(((a->
                                             super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->x).value +
                                   lVar4));
        local_40[0]._0_4_ = nVar2._0_4_;
        local_40[0].z = nVar2.z.value;
        nVar2 = operator*((float)t,(normal3h *)((long)&(pnVar1->x).value + lVar4));
        local_48._0_4_ = nVar2._0_4_;
        local_48.z = nVar2.z.value;
        nVar2 = operator+(local_40,&local_48);
        pnVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(int *)((long)&(pnVar1->x).value + lVar4) = nVar2._0_4_;
        *(uint16_t *)((long)&(pnVar1->z).value + lVar4) = nVar2.z.value.value;
        lVar4 = lVar4 + 6;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}